

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.cpp
# Opt level: O0

int docall(lua_State *L,int narg,int nres)

{
  int iVar1;
  int iVar2;
  int base;
  int status;
  int nres_local;
  int narg_local;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 - narg;
  lua_pushcclosure(L,traceback,0);
  lua_insert(L,iVar1);
  globalL = L;
  signal(2,laction);
  iVar2 = lua_pcallk(L,narg,nres,iVar1,0,(_func_int_lua_State_ptr *)0x0);
  signal(2,(__sighandler_t)0x0);
  lua_remove(L,iVar1);
  return iVar2;
}

Assistant:

static int docall (lua_State *L, int narg, int nres) {
  int status;
  int base = lua_gettop(L) - narg;  /* function index */
  lua_pushcfunction(L, traceback);  /* push traceback function */
  lua_insert(L, base);  /* put it under chunk and args */
  globalL = L;  /* to be available to 'laction' */
  signal(SIGINT, laction);
  status = lua_pcall(L, narg, nres, base);
  signal(SIGINT, SIG_DFL);
  lua_remove(L, base);  /* remove traceback function */
  return status;
}